

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode baller_start(Curl_cfilter *cf,Curl_easy *data,eyeballer *baller,timediff_t timeoutms)

{
  Curl_cfilter *pCVar1;
  curl_trc_feat *pcVar2;
  Curl_cfilter *pCVar3;
  CURLcode CVar4;
  CURLcode CVar5;
  CURLcode extraout_EAX;
  undefined8 in_RAX;
  ulong uVar6;
  Curl_addrinfo *pCVar7;
  Curl_addrinfo *extraout_RAX;
  Curl_addrinfo *pCVar8;
  Curl_addrinfo *extraout_RAX_00;
  ulong extraout_RAX_01;
  Curl_cfilter **ppCVar9;
  curltime cVar10;
  Curl_cfilter *local_38;
  
  baller->error = 0;
  uVar6 = CONCAT71((int7)((ulong)in_RAX >> 8),baller->field_0x64) & 0xfffffffffffffff5 | 2;
  baller->field_0x64 = (char)uVar6;
  do {
    CVar4 = (CURLcode)uVar6;
    if (baller->addr == (Curl_addrinfo *)0x0) {
LAB_0011bd80:
      baller->field_0x64 = baller->field_0x64 | 4;
      return CVar4;
    }
    cVar10 = Curl_now();
    (baller->started).tv_sec = cVar10.tv_sec;
    (baller->started).tv_usec = cVar10.tv_usec;
    pCVar8 = baller->addr;
    pCVar7 = addr_next_match(pCVar8,baller->ai_family);
    baller->timeoutms = (ulong)timeoutms >> (pCVar7 != (Curl_addrinfo *)0x0 && 600 < timeoutms);
    pCVar1 = baller->cf;
    local_38 = pCVar1;
    CVar5 = (*baller->cf_create)(&baller->cf,data,cf->conn,pCVar8,*cf->ctx);
    ppCVar9 = &baller->cf;
    if (CVar5 == CURLE_OK) {
      while (pCVar3 = *ppCVar9, pCVar3 != (Curl_cfilter *)0x0) {
        pCVar3->conn = cf->conn;
        pCVar3->sockindex = cf->sockindex;
        ppCVar9 = &pCVar3->next;
      }
      pCVar8 = addr_next_match(baller->addr,baller->ai_family);
      if (pCVar8 != (Curl_addrinfo *)0x0) {
        Curl_expire(data,baller->timeoutms,baller->timeout_id);
        pCVar8 = extraout_RAX_00;
      }
    }
    else {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"%s failed",baller->name);
      }
      baller_close(baller,data);
      pCVar8 = extraout_RAX;
    }
    CVar4 = (CURLcode)pCVar8;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      Curl_conn_cf_discard_chain(&local_38,data);
      CVar4 = extraout_EAX;
    }
    baller->result = CVar5;
    if (CVar5 == CURLE_OK) {
      if (baller->addr != (Curl_addrinfo *)0x0) {
        return CVar4;
      }
      goto LAB_0011bd80;
    }
    baller_next_addr(baller);
    uVar6 = extraout_RAX_01;
  } while( true );
}

Assistant:

static CURLcode baller_start(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             struct eyeballer *baller,
                             timediff_t timeoutms)
{
  baller->error = 0;
  baller->connected = FALSE;
  baller->has_started = TRUE;

  while(baller->addr) {
    baller->started = Curl_now();
    baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
      USETIME(timeoutms) : timeoutms;
    baller_initiate(cf, data, baller);
    if(!baller->result)
      break;
    baller_next_addr(baller);
  }
  if(!baller->addr) {
    baller->is_done = TRUE;
  }
  return baller->result;
}